

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DnnTrainer.cpp
# Opt level: O1

DNN_NUMERIC __thiscall tfs::DnnTrainer::train(DnnTrainer *this,DNN_INTEGER expectation)

{
  bool bVar1;
  ulong uVar2;
  unsigned_long line;
  char *format;
  DNN_NUMERIC DVar3;
  DNN_NUMERIC extraout_XMM0_Qa;
  
  this->m_loss = 0.0;
  if (this->m_dnn == (Dnn *)0x0) {
    format = "No DNN set";
    line = 0xd9;
  }
  else if (this->m_batch_size == 0) {
    format = "Batch size 0 - will be a divide by zero error";
    line = 0xdd;
  }
  else {
    if ((this->m_trainable_handle != (Trainable **)0x0) &&
       (this->m_trainable_end != (Trainable **)0x0)) {
      bVar1 = Dnn::forward(this->m_dnn);
      if (bVar1) {
        DVar3 = Dnn::backprop(this->m_dnn,expectation);
        this->m_loss = DVar3;
        uVar2 = this->m_k + 1;
        this->m_k = uVar2;
        if (uVar2 % this->m_batch_size != 0) {
          return DVar3;
        }
        (**this->_vptr_DnnTrainer)(this);
        return extraout_XMM0_Qa;
      }
      goto LAB_00118135;
    }
    format = "No gradients available for training";
    line = 0xe1;
  }
  report_problem("Error",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/barrettd[P]tfs_dnn/src/DnnTrainer.cpp"
                 ,"train",line,format);
LAB_00118135:
  return this->m_loss;
}

Assistant:

DNN_NUMERIC
    DnnTrainer::train( const DNN_INTEGER expectation ) {
        // Assume: Input matrix already set for the DNN
        m_loss = 0.0;
        if( m_dnn == 0 ) {
            log_error( "No DNN set" );
            return m_loss;
        }
        if( m_batch_size == 0 ) {
            log_error( "Batch size 0 - will be a divide by zero error" );
            return m_loss;
        }
        if( m_trainable_handle == 0 || m_trainable_end == 0 ) {
            log_error( "No gradients available for training" );
            return m_loss;
        }
        if( !m_dnn->forward()) {
            return m_loss;
        }
        m_loss = m_dnn->backprop( expectation );
        m_k++;
        if( m_k % m_batch_size ) {
            return m_loss;
        }
        return adjustWeights();
    }